

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hh
# Opt level: O1

string * __thiscall
tchecker::system::processes_t::process_name_abi_cxx11_(processes_t *this,process_id_t id)

{
  invalid_argument *this_00;
  const_iterator it;
  flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60 [3];
  
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::find(local_60,(key_type *)&(this->_procs_index)._value_map);
  if (local_60[0].m_data.m_seq.m_holder.m_start !=
      (this->_procs_index)._value_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
      (this->_procs_index)._value_map.m_flat_tree.m_data.m_seq.m_holder.m_size) {
    return &(local_60[0].m_data.m_seq.m_holder.m_start)->second;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"value is not indexed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline std::string const & process_name(tchecker::process_id_t id) const
  {
    try {
      return _procs_index.key(id);
    }
    catch (...) {
      throw std::invalid_argument("Unknown process identifier " + std::to_string(id));
    }
  }